

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,cs_impl::any::holder<cs::object_method>*>
          (allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider> *this,
          int *args,holder<cs::object_method> **args_1)

{
  int iVar1;
  long lVar2;
  holder<cs::object_method> *phVar3;
  proxy *ppVar4;
  
  if ((*(long *)(this + 0x1008) == 0) || (global_thread_counter != 0)) {
    ppVar4 = (proxy *)operator_new(0x18);
  }
  else {
    lVar2 = *(long *)(this + 0x1008);
    *(long *)(this + 0x1008) = lVar2 + -1;
    ppVar4 = *(proxy **)(this + lVar2 * 8 + -8);
  }
  iVar1 = *args;
  phVar3 = *args_1;
  ppVar4->is_rvalue = false;
  ppVar4->protect_level = 0;
  ppVar4->refcount = (long)iVar1;
  ppVar4->data = &phVar3->super_baseHolder;
  return ppVar4;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}